

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  byte bVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  LogMessage *pLVar5;
  Descriptor *pDVar6;
  undefined4 extraout_var;
  int64 iVar7;
  undefined4 extraout_var_00;
  MessageLite *pMVar8;
  LogFinisher local_61;
  Extension *extension;
  LogMessage local_58;
  undefined4 extraout_var_01;
  
  bVar2 = MaybeNewExtension(this,*(int *)(descriptor + 0x38),descriptor,&extension);
  if (bVar2) {
    TVar3 = FieldDescriptor::type(descriptor);
    extension->type = (FieldType)TVar3;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(TVar3 & 0xff) * 4) != 10) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xa8);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type(extension->type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
    extension->is_repeated = false;
    extension->is_packed = false;
    pDVar6 = FieldDescriptor::message_type(descriptor);
    iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar6);
    extension->field_0xa = extension->field_0xa & 0xf;
    iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))
                      ((long *)CONCAT44(extraout_var,iVar4),this->arena_);
    (extension->field_0).int64_value = iVar7;
    extension->field_0xa = extension->field_0xa & 0xf0;
    pMVar8 = (MessageLite *)(extension->field_0).int64_value;
  }
  else {
    if (extension->is_repeated == true) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xb2);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=(&local_61,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)extension->type * 4) != 10) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xb2);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
    bVar1 = extension->field_0xa;
    extension->field_0xa = bVar1 & 0xf0;
    pMVar8 = (extension->field_0).message_value;
    if ((bVar1 & 0x10) != 0) {
      pDVar6 = FieldDescriptor::message_type(descriptor);
      iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar6);
      iVar4 = (*pMVar8->_vptr_MessageLite[4])(pMVar8,CONCAT44(extraout_var_00,iVar4));
      pMVar8 = (MessageLite *)CONCAT44(extraout_var_01,iVar4);
    }
  }
  return pMVar8;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_packed = false;
    const MessageLite* prototype =
        factory->GetPrototype(descriptor->message_type());
    extension->is_lazy = false;
    extension->message_value = prototype->New(arena_);
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(
          *factory->GetPrototype(descriptor->message_type()));
    } else {
      return extension->message_value;
    }
  }
}